

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setZValue(QGraphicsItem *this,qreal z)

{
  undefined1 *puVar1;
  uint *puVar2;
  long lVar3;
  long *plVar4;
  QGraphicsScene *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  qreal newZ;
  QVariant local_88;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 uStack_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)&local_68,z);
  (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x17,&local_68);
  ::QVariant::~QVariant((QVariant *)&local_68);
  newZ = (qreal)::QVariant::toReal((bool *)local_48.data);
  pQVar6 = (this->d_ptr).d;
  if ((newZ != pQVar6->z) || (NAN(newZ) || NAN(pQVar6->z))) {
    if ((pQVar6->scene != (QGraphicsScene *)0x0) &&
       (lVar3 = *(long *)&pQVar6->scene->field_0x8, *(int *)(lVar3 + 0x84) != -1)) {
      plVar4 = *(long **)(lVar3 + 0x88);
      (**(code **)(*plVar4 + 200))(plVar4,this,0x17,&newZ);
      pQVar6 = (this->d_ptr).d;
    }
    pQVar6->z = newZ;
    if (pQVar6->parent == (QGraphicsItem *)0x0) {
      if (pQVar6->scene != (QGraphicsScene *)0x0) {
        puVar2 = (uint *)(*(long *)&pQVar6->scene->field_0x8 + 0xb8);
        *puVar2 = *puVar2 | 0x20;
      }
    }
    else {
      puVar1 = &((pQVar6->parent->d_ptr).d)->field_0x160;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000;
    }
    pQVar5 = ((this->d_ptr).d)->scene;
    if (pQVar5 != (QGraphicsScene *)0x0) {
      local_68._16_8_ = 0;
      uStack_50 = 0;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      QGraphicsScenePrivate::markDirty
                (*(QGraphicsScenePrivate **)&pQVar5->field_0x8,this,(QRectF *)&local_68,true,false,
                 false,false,false);
    }
    (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x18,&local_48);
    ::QVariant::~QVariant(&local_88);
    uVar7 = *(ulong *)&((this->d_ptr).d)->field_0x160;
    if ((uVar7 >> 0x2d & 1) != 0) {
      setFlag(this,ItemStacksBehindParent,z < 0.0);
      uVar7 = *(ulong *)&((this->d_ptr).d)->field_0x160;
    }
    if ((uVar7 >> 0x38 & 1) != 0) {
      QGraphicsObject::zChanged((QGraphicsObject *)(this + -1));
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setZValue(qreal z)
{
    const QVariant newZVariant(itemChange(ItemZValueChange, z));
    qreal newZ = newZVariant.toReal();
    if (newZ == d_ptr->z)
        return;

    if (d_ptr->scene && d_ptr->scene->d_func()->indexMethod != QGraphicsScene::NoIndex) {
        // Z Value has changed, we have to notify the index.
        d_ptr->scene->d_func()->index->itemChange(this, ItemZValueChange, &newZ);
    }

    d_ptr->z = newZ;
    if (d_ptr->parent)
        d_ptr->parent->d_ptr->needSortChildren = 1;
    else if (d_ptr->scene)
        d_ptr->scene->d_func()->needSortTopLevelItems = 1;

    if (d_ptr->scene)
        d_ptr->scene->d_func()->markDirty(this, QRectF(), /*invalidateChildren=*/true);

    itemChange(ItemZValueHasChanged, newZVariant);

    if (d_ptr->flags & ItemNegativeZStacksBehindParent)
        setFlag(QGraphicsItem::ItemStacksBehindParent, z < qreal(0.0));

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->zChanged();
}